

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *strPair)

{
  bool bVar1;
  char *p_00;
  StrPair *strPair_local;
  char *p_local;
  XMLElement *this_local;
  
  strPair_local = (StrPair *)XMLUtil::SkipWhiteSpace(p);
  if ((char)strPair_local->_flags == '/') {
    this->_closingType = 2;
    strPair_local = (StrPair *)((long)&strPair_local->_flags + 1);
  }
  p_00 = StrPair::ParseName(&(this->super_XMLNode)._value,(char *)strPair_local);
  bVar1 = StrPair::Empty(&(this->super_XMLNode)._value);
  if (bVar1) {
    this_local = (XMLElement *)0x0;
  }
  else {
    this_local = (XMLElement *)ParseAttributes(this,p_00);
    if (((this_local != (XMLElement *)0x0) &&
        (*(char *)&(this_local->super_XMLNode)._vptr_XMLNode != '\0')) && (this->_closingType == 0))
    {
      this_local = (XMLElement *)XMLNode::ParseDeep(&this->super_XMLNode,(char *)this_local,strPair)
      ;
    }
  }
  return (char *)this_local;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* strPair )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p );
    if ( !p || !*p || _closingType ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, strPair );
    return p;
}